

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O1

bool __thiscall
ddd::DaTrie<true,_true,_false>::is_target_ex_
          (DaTrie<true,_true,_false> *this,uint32_t base,Edge *edge)

{
  size_t sVar1;
  Bc BVar2;
  ulong upper;
  uint uVar3;
  size_t sVar4;
  Edge *__range2;
  size_t sVar5;
  bool bVar6;
  
  sVar1 = edge->size_;
  if (sVar1 == 0) {
    __assert_fail("0 < edge.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kampersanda[P]ddd/include/DaTrie.hpp"
                  ,0x3c3,
                  "bool ddd::DaTrie<true, true, false>::is_target_ex_(uint32_t, const Edge &) const [WithBLM = true, WithNLM = true, Prefix = false]"
                 );
  }
  uVar3 = (uint)edge->labels_[0];
  if (edge->labels_[0] == base) {
    bVar6 = false;
  }
  else {
    sVar5 = 1;
    bVar6 = false;
    do {
      BVar2 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
              super__Vector_impl_data._M_start[uVar3 ^ base];
      if (((long)BVar2 < 0) &&
         (upper = edge->size_, sVar4 = edge_size_(this,BVar2._4_4_ & 0x7fffffff,upper),
         upper <= sVar4)) {
        return bVar6;
      }
      bVar6 = sVar1 == sVar5;
      if (bVar6) {
        return bVar6;
      }
      uVar3 = (uint)edge->labels_[sVar5];
      sVar5 = sVar5 + 1;
    } while (uVar3 != base);
  }
  return bVar6;
}

Assistant:

bool is_target_ex_(uint32_t base, const Edge& edge) const {
    assert(0 < edge.size());

    for (auto label : edge) {
      auto child_pos = base ^label;
      if (child_pos == ROOT_POS) {
        return false;
      }
      if (bc_[child_pos].is_fixed()) {
        auto node_pos = bc_[child_pos].check();
        if (edge.size() <= edge_size_(node_pos, edge.size())) {
          return false;
        }
      }
    }
    return true;
  }